

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
pstore::uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>
          (uint128 *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out)

{
  ulong uVar1;
  uint uVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char local_29;
  uint local_28;
  int local_24;
  uint shift;
  uint emitted;
  uint128 *this_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out_local;
  
  local_24 = 0;
  _shift = this;
  this_local = (uint128 *)out.container;
  for (local_28 = 4; local_28 < 0x81; local_28 = local_28 + 4) {
    uVar1 = *(ulong *)((long)&this->v_ + 8);
    bVar3 = 0x80 - (char)local_28;
    uVar2 = (uint)((ulong)this->v_ >> (bVar3 & 0x3f)) | (uint)(uVar1 << 0x40 - (bVar3 & 0x3f));
    if ((bVar3 & 0x40) != 0) {
      uVar2 = (uint)(uVar1 >> (bVar3 & 0x3f));
    }
    local_29 = digit_to_hex(uVar2 & 0xf);
    local_38 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&this_local,0);
    this_00 = std::
              back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_38);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(this_00,&local_29);
    local_24 = local_24 + 1;
  }
  if (local_24 == 0x20) {
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
  }
  assert_failed("emitted == hex_string_length",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/uint128.hpp"
                ,0x1b7);
}

Assistant:

OutputIterator uint128::to_hex (OutputIterator out) const noexcept {
#ifndef NDEBUG
        auto emitted = 0U;
#endif
#ifdef PSTORE_HAVE_UINT128_T
        for (auto shift = 4U; shift <= 128U; shift += 4U) {
            *(out++) = digit_to_hex ((v_ >> (128U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#else
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((high_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
        for (auto shift = 4U; shift <= 64; shift += 4U) {
            *(out++) = digit_to_hex ((low_ >> (64U - shift)) & 0x0FU);
#    ifndef NDEBUG
            ++emitted;
#    endif
        }
#endif
        PSTORE_ASSERT (emitted == hex_string_length);
        return out;
    }